

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cLayoutBindingTests.cpp
# Opt level: O3

StringIntMap * __thiscall
glcts::AtomicCounterLayoutBindingCase::AtomicCounterLayoutBindingProgram::getBindingPoints
          (StringIntMap *__return_storage_ptr__,AtomicCounterLayoutBindingProgram *this,
          StringVector *args)

{
  _Rb_tree_header *p_Var1;
  GLint GVar2;
  GLuint GVar3;
  GLenum GVar4;
  mapped_type_conflict *pmVar5;
  pointer __k;
  GLint value;
  GLint atomic_counter_buffer_idx;
  GLenum param;
  
  p_Var1 = &(__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
  __k = (args->
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )._M_impl.super__Vector_impl_data._M_start;
  if (__k != (args->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish) {
    do {
      GVar3 = (*((this->super_LayoutBindingProgram).m_gl)->getProgramResourceIndex)
                        ((((this->super_LayoutBindingProgram).m_program)->m_program).m_program,
                         0x92e1,(__k->_M_dataplus)._M_p);
      if (GVar3 != 0xffffffff) {
        param = 0x9301;
        atomic_counter_buffer_idx = -1;
        (*((this->super_LayoutBindingProgram).m_gl)->getProgramResourceiv)
                  ((((this->super_LayoutBindingProgram).m_program)->m_program).m_program,0x92e1,
                   GVar3,1,&param,1,(GLsizei *)0x0,&atomic_counter_buffer_idx);
        GVar4 = (*((this->super_LayoutBindingProgram).m_gl)->getError)();
        if (GVar4 == 0 && atomic_counter_buffer_idx != -1) {
          param = 0x9302;
          value = -1;
          (*((this->super_LayoutBindingProgram).m_gl)->getProgramResourceiv)
                    ((((this->super_LayoutBindingProgram).m_program)->m_program).m_program,0x92c0,
                     atomic_counter_buffer_idx,1,&param,1,(GLsizei *)0x0,&value);
          GVar4 = (*((this->super_LayoutBindingProgram).m_gl)->getError)();
          GVar2 = value;
          if (GVar4 == 0 && value != -1) {
            pmVar5 = std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                     ::operator[](__return_storage_ptr__,__k);
            *pmVar5 = GVar2;
          }
        }
      }
      __k = __k + 1;
    } while (__k != (args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish);
  }
  return __return_storage_ptr__;
}

Assistant:

StringIntMap getBindingPoints(StringVector args) const
		{
			StringIntMap bindingPoints;

			for (StringVector::iterator it = args.begin(); it != args.end(); it++)
			{
				glw::GLuint idx = gl().getProgramResourceIndex(getProgram(), GL_UNIFORM, (*it).c_str());
				if (idx != GL_INVALID_INDEX)
				{
					glw::GLenum param					  = GL_ATOMIC_COUNTER_BUFFER_INDEX;
					glw::GLint  atomic_counter_buffer_idx = -1;
					gl().getProgramResourceiv(getProgram(), GL_UNIFORM, idx, 1, &param, 1, NULL,
											  &atomic_counter_buffer_idx);
					bool hasNoError = (GL_NO_ERROR == gl().getError()) && (-1 != atomic_counter_buffer_idx);
					if (!hasNoError)
						continue;

					param			 = GL_BUFFER_BINDING;
					glw::GLint value = -1;
					gl().getProgramResourceiv(getProgram(), GL_ATOMIC_COUNTER_BUFFER, atomic_counter_buffer_idx, 1,
											  &param, 1, NULL, &value);
					hasNoError = (GL_NO_ERROR == gl().getError()) && (-1 != value);
					if (!hasNoError)
						continue;

					bindingPoints[*it] = value;
				}
			}
			return bindingPoints;
		}